

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::CompilerMSL(CompilerMSL *this,uint32_t *ir_,size_t word_count)

{
  _Rb_tree_header *p_Var1;
  allocator local_9f;
  allocator local_9e;
  allocator local_9d;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  allocator local_98;
  allocator local_97;
  allocator local_96;
  allocator local_95;
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  
  CompilerGLSL::CompilerGLSL(&this->super_CompilerGLSL,ir_,word_count);
  (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
       (_func_int **)&PTR__CompilerMSL_0039e0e0;
  (this->function_global_vars)._M_h._M_buckets = &(this->function_global_vars)._M_h._M_single_bucket
  ;
  (this->function_global_vars)._M_h._M_bucket_count = 1;
  (this->function_global_vars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->function_global_vars)._M_h._M_element_count = 0;
  (this->function_global_vars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->function_global_vars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->function_global_vars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->builtin_frag_coord_id = 0;
  this->builtin_sample_id_id = 0;
  this->builtin_sample_mask_id = 0;
  this->builtin_helper_invocation_id = 0;
  this->builtin_vertex_idx_id = 0;
  this->builtin_base_vertex_id = 0;
  this->builtin_instance_idx_id = 0;
  this->builtin_base_instance_id = 0;
  this->builtin_view_idx_id = 0;
  this->builtin_layer_id = 0;
  this->builtin_invocation_id_id = 0;
  this->builtin_primitive_id_id = 0;
  this->builtin_subgroup_invocation_id_id = 0;
  this->builtin_subgroup_size_id = 0;
  this->builtin_dispatch_base_id = 0;
  this->builtin_stage_input_size_id = 0;
  this->builtin_local_invocation_index_id = 0;
  this->builtin_workgroup_size_id = 0;
  this->builtin_frag_depth_id = 0;
  this->swizzle_buffer_id = 0;
  this->buffer_size_buffer_id = 0;
  this->view_mask_buffer_id = 0;
  this->dynamic_offsets_buffer_id = 0;
  this->uint_type_id = 0;
  *(undefined8 *)((long)&this->uint_type_id + 2) = 0;
  *(undefined8 *)((long)&this->argument_buffer_padding_image_type_id + 2) = 0;
  Options::Options(&this->msl_options);
  p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->inputs_by_builtin)._M_h._M_buckets = &(this->inputs_by_builtin)._M_h._M_single_bucket;
  (this->inputs_by_builtin)._M_h._M_bucket_count = 1;
  (this->inputs_by_builtin)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inputs_by_builtin)._M_h._M_element_count = 0;
  (this->inputs_by_builtin)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inputs_by_builtin)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inputs_by_builtin)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header;
  (this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->outputs_by_location)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->outputs_by_builtin)._M_h._M_buckets = &(this->outputs_by_builtin)._M_h._M_single_bucket;
  (this->outputs_by_builtin)._M_h._M_bucket_count = 1;
  (this->outputs_by_builtin)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->outputs_by_builtin)._M_h._M_element_count = 0;
  (this->outputs_by_builtin)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->outputs_by_builtin)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->outputs_by_builtin)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->location_inputs_in_use)._M_h._M_buckets =
       &(this->location_inputs_in_use)._M_h._M_single_bucket;
  (this->location_inputs_in_use)._M_h._M_bucket_count = 1;
  (this->location_inputs_in_use)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->location_inputs_in_use)._M_h._M_element_count = 0;
  (this->location_inputs_in_use)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->location_inputs_in_use)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->location_inputs_in_use)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->location_inputs_in_use_fallback)._M_h._M_buckets =
       &(this->location_inputs_in_use_fallback)._M_h._M_single_bucket;
  (this->location_inputs_in_use_fallback)._M_h._M_bucket_count = 1;
  (this->location_inputs_in_use_fallback)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->location_inputs_in_use_fallback)._M_h._M_element_count = 0;
  (this->location_inputs_in_use_fallback)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->location_inputs_in_use_fallback)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->location_inputs_in_use_fallback)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->location_outputs_in_use)._M_h._M_buckets =
       &(this->location_outputs_in_use)._M_h._M_single_bucket;
  (this->location_outputs_in_use)._M_h._M_bucket_count = 1;
  (this->location_outputs_in_use)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->location_outputs_in_use)._M_h._M_element_count = 0;
  (this->location_outputs_in_use)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->location_outputs_in_use)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->location_outputs_in_use)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->location_outputs_in_use_fallback)._M_h._M_buckets =
       &(this->location_outputs_in_use_fallback)._M_h._M_single_bucket;
  (this->location_outputs_in_use_fallback)._M_h._M_bucket_count = 1;
  (this->location_outputs_in_use_fallback)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->location_outputs_in_use_fallback)._M_h._M_element_count = 0;
  (this->location_outputs_in_use_fallback)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->location_outputs_in_use_fallback)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->location_outputs_in_use_fallback)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->fragment_output_components)._M_h._M_buckets =
       &(this->fragment_output_components)._M_h._M_single_bucket;
  (this->fragment_output_components)._M_h._M_bucket_count = 1;
  (this->fragment_output_components)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fragment_output_components)._M_h._M_element_count = 0;
  (this->fragment_output_components)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fragment_output_components)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fragment_output_components)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->builtin_to_automatic_input_location)._M_h._M_buckets =
       &(this->builtin_to_automatic_input_location)._M_h._M_single_bucket;
  (this->builtin_to_automatic_input_location)._M_h._M_bucket_count = 1;
  (this->builtin_to_automatic_input_location)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->builtin_to_automatic_input_location)._M_h._M_element_count = 0;
  (this->builtin_to_automatic_input_location)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->builtin_to_automatic_input_location)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->builtin_to_automatic_input_location)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->builtin_to_automatic_output_location)._M_h._M_buckets =
       &(this->builtin_to_automatic_output_location)._M_h._M_single_bucket;
  (this->builtin_to_automatic_output_location)._M_h._M_bucket_count = 1;
  (this->builtin_to_automatic_output_location)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->builtin_to_automatic_output_location)._M_h._M_element_count = 0;
  (this->builtin_to_automatic_output_location)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->builtin_to_automatic_output_location)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->builtin_to_automatic_output_location)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->pragma_lines)._M_t._M_impl.super__Rb_tree_header;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->typedef_lines)._M_t._M_impl.super__Rb_tree_header;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->vars_needing_early_declaration).stack_storage;
  (this->vars_needing_early_declaration).buffer_capacity = 8;
  (this->resource_bindings)._M_h._M_buckets = &(this->resource_bindings)._M_h._M_single_bucket;
  (this->resource_bindings)._M_h._M_bucket_count = 1;
  (this->resource_bindings)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->resource_bindings)._M_h._M_element_count = 0;
  (this->resource_bindings)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->resource_bindings)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->resource_bindings)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_buckets =
       &(this->resource_arg_buff_idx_to_binding_number)._M_h._M_single_bucket;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_bucket_count = 1;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_element_count = 0;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->resource_arg_buff_idx_to_binding_number)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->resource_arg_buff_idx_to_binding_number)._M_h._M_single_bucket + 4)
       = 0;
  this->next_metal_resource_index_texture = 0;
  this->next_metal_resource_index_sampler = 0;
  *(undefined8 *)((long)&this->needs_base_instance_arg + 1) = 0;
  this->needs_swizzle_buffer_def = false;
  this->used_swizzle_buffer = false;
  this->added_builtin_tess_level = false;
  this->needs_subgroup_invocation_id = false;
  this->needs_subgroup_size = false;
  this->needs_sample_id = false;
  this->needs_helper_invocation = false;
  this->writes_to_depth = false;
  this->stage_out_masked_builtin_type_id = 0;
  this->needs_base_vertex_arg = Neutral;
  this->needs_base_instance_arg = Neutral;
  this->has_sampled_images = false;
  this->builtin_declaration = false;
  this->is_using_builtin_array = false;
  this->is_rasterization_disabled = false;
  this->stage_in_ptr_var_id = 0;
  this->stage_out_ptr_var_id = 0;
  this->tess_level_inner_var_id = 0;
  this->tess_level_outer_var_id = 0;
  this->stage_in_var_id = 0;
  this->stage_out_var_id = 0;
  this->patch_stage_in_var_id = 0;
  this->patch_stage_out_var_id = 0;
  (this->qual_pos_var_name)._M_dataplus._M_p = (pointer)&(this->qual_pos_var_name).field_2;
  (this->qual_pos_var_name)._M_string_length = 0;
  (this->qual_pos_var_name).field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&this->stage_in_var_name,"in",&local_91);
  local_48 = &this->stage_in_var_name;
  ::std::__cxx11::string::string((string *)&this->stage_out_var_name,"out",&local_92);
  local_50 = &this->stage_out_var_name;
  ::std::__cxx11::string::string((string *)&this->patch_stage_in_var_name,"patchIn",&local_93);
  local_58 = &this->patch_stage_in_var_name;
  ::std::__cxx11::string::string((string *)&this->patch_stage_out_var_name,"patchOut",&local_94);
  local_68 = &this->sampler_name_suffix;
  local_60 = &this->patch_stage_out_var_name;
  ::std::__cxx11::string::string((string *)local_68,"Smplr",&local_95);
  local_70 = &this->swizzle_name_suffix;
  ::std::__cxx11::string::string((string *)local_70,"Swzl",&local_96);
  local_78 = &this->buffer_size_name_suffix;
  ::std::__cxx11::string::string((string *)local_78,"BufferSize",&local_97);
  local_80 = &this->plane_name_suffix;
  ::std::__cxx11::string::string((string *)local_80,"Plane",&local_98);
  local_88 = &this->input_wg_var_name;
  ::std::__cxx11::string::string((string *)local_88,"gl_in",&local_99);
  local_90 = &this->input_buffer_var_name;
  ::std::__cxx11::string::string((string *)local_90,"spvIn",&local_9a);
  ::std::__cxx11::string::string((string *)&this->output_buffer_var_name,"spvOut",&local_9b);
  ::std::__cxx11::string::string
            ((string *)&this->patch_input_buffer_var_name,"spvPatchIn",&local_9c);
  ::std::__cxx11::string::string
            ((string *)&this->patch_output_buffer_var_name,"spvPatchOut",&local_9d);
  ::std::__cxx11::string::string
            ((string *)&this->tess_factor_buffer_var_name,"spvTessLevel",&local_9e);
  ::std::__cxx11::string::string((string *)&this->index_buffer_var_name,"spvIndices",&local_9f);
  this->previous_instruction_opcode = OpNop;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->constexpr_samplers_by_binding)._M_h._M_buckets =
       &(this->constexpr_samplers_by_binding)._M_h._M_single_bucket;
  (this->constexpr_samplers_by_binding)._M_h._M_bucket_count = 1;
  (this->constexpr_samplers_by_binding)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->constexpr_samplers_by_binding)._M_h._M_element_count = 0;
  (this->constexpr_samplers_by_binding)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->constexpr_samplers_by_binding)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->constexpr_samplers_by_binding)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffers_requiring_array_length)._M_h._M_buckets =
       &(this->buffers_requiring_array_length)._M_h._M_single_bucket;
  (this->buffers_requiring_array_length)._M_h._M_bucket_count = 1;
  (this->buffers_requiring_array_length)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->buffers_requiring_array_length)._M_h._M_element_count = 0;
  (this->buffers_requiring_array_length)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->buffers_requiring_array_length)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->buffers_requiring_array_length)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffer_aliases_argument).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.
  buffer_size = 0;
  (this->buffer_aliases_argument).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr =
       (pair<unsigned_int,_unsigned_int> *)&(this->buffer_aliases_argument).stack_storage;
  (this->buffer_aliases_argument).buffer_capacity = 8;
  (this->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->buffer_aliases_discrete).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->buffer_aliases_discrete).stack_storage;
  (this->buffer_aliases_discrete).buffer_capacity = 8;
  (this->atomic_image_vars_emulated)._M_h._M_buckets =
       &(this->atomic_image_vars_emulated)._M_h._M_single_bucket;
  (this->atomic_image_vars_emulated)._M_h._M_bucket_count = 1;
  (this->atomic_image_vars_emulated)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->atomic_image_vars_emulated)._M_h._M_element_count = 0;
  (this->atomic_image_vars_emulated)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->atomic_image_vars_emulated)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->atomic_image_vars_emulated)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pull_model_inputs)._M_h._M_buckets = &(this->pull_model_inputs)._M_h._M_single_bucket;
  (this->pull_model_inputs)._M_h._M_bucket_count = 1;
  (this->pull_model_inputs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pull_model_inputs)._M_h._M_element_count = 0;
  (this->pull_model_inputs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pull_model_inputs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pull_model_inputs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->recursive_inputs)._M_h._M_buckets = &(this->recursive_inputs)._M_h._M_single_bucket;
  (this->recursive_inputs)._M_h._M_bucket_count = 1;
  (this->recursive_inputs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->recursive_inputs)._M_h._M_element_count = 0;
  (this->recursive_inputs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->recursive_inputs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->recursive_inputs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = 0;
  (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr =
       (SPIRVariable **)&(this->entry_point_bindings).stack_storage;
  (this->entry_point_bindings).buffer_capacity = 8;
  p_Var1 = &(this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->disabled_frag_outputs).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->disabled_frag_outputs).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->disabled_frag_outputs).stack_storage;
  (this->disabled_frag_outputs).buffer_capacity = 8;
  (this->inline_uniform_blocks)._M_h._M_buckets =
       &(this->inline_uniform_blocks)._M_h._M_single_bucket;
  (this->inline_uniform_blocks)._M_h._M_bucket_count = 1;
  (this->inline_uniform_blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inline_uniform_blocks)._M_h._M_element_count = 0;
  (this->inline_uniform_blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inline_uniform_blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inline_uniform_blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->argument_buffer_discrete_mask = 0;
  this->argument_buffer_device_storage_mask = 0;
  this->suppress_missing_prototypes = false;
  this->suppress_incompatible_pointer_types_discard_qualifiers = false;
  return;
}

Assistant:

CompilerMSL::CompilerMSL(const uint32_t *ir_, size_t word_count)
    : CompilerGLSL(ir_, word_count)
{
}